

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O1

void __thiscall icu_63::RuleBasedTimeZone::deleteTransitions(RuleBasedTimeZone *this)

{
  UVector *this_00;
  void *buffer;
  
  if (this->fHistoricTransitions != (UVector *)0x0) {
    while (this_00 = this->fHistoricTransitions, this_00->count != 0) {
      buffer = UVector::orphanElementAt(this_00,0);
      uprv_free_63(buffer);
    }
    if (this_00 != (UVector *)0x0) {
      (*(this_00->super_UObject)._vptr_UObject[1])();
    }
  }
  this->fHistoricTransitions = (UVector *)0x0;
  return;
}

Assistant:

void
RuleBasedTimeZone::deleteTransitions(void) {
    if (fHistoricTransitions != NULL) {
        while (!fHistoricTransitions->isEmpty()) {
            Transition *trs = (Transition*)fHistoricTransitions->orphanElementAt(0);
            uprv_free(trs);
        }
        delete fHistoricTransitions;
    }
    fHistoricTransitions = NULL;
}